

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall SerialExecutionQueue::cancelAllJobs(SerialExecutionQueue *this)

{
  int __fd;
  SerialExecutionQueue *local_48;
  code *local_40;
  undefined8 local_38;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> local_30;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard_1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  SerialExecutionQueue *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&(this->spawnedProcesses).mutex);
  guard_1._M_device._4_1_ = std::atomic::operator_cast_to_bool((atomic *)&this->cancelled);
  if (!guard_1._M_device._4_1_) {
    __fd = 1;
    std::atomic<bool>::operator=(&this->cancelled,true);
    llbuild::basic::ProcessGroup::close(&this->spawnedProcesses,__fd);
  }
  guard_1._M_device._5_3_ = 0;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  if (guard_1._M_device._4_4_ == 0) {
    llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,2);
    std::lock_guard<std::mutex>::lock_guard(&local_28,&this->killAfterTimeoutThreadMutex);
    local_40 = killAfterTimeout;
    local_38 = 0;
    local_48 = this;
    llvm::make_unique<std::thread,void(SerialExecutionQueue::*)(),SerialExecutionQueue*>
              ((llvm *)&local_30,(type *)&local_40,&local_48);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
              (&this->killAfterTimeoutThread,&local_30);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&local_30);
    std::lock_guard<std::mutex>::~lock_guard(&local_28);
  }
  return;
}

Assistant:

virtual void cancelAllJobs() override {
    {
      std::lock_guard<std::mutex> guard(spawnedProcesses.mutex);
      if (cancelled) return;
      cancelled = true;
      spawnedProcesses.close();
    }

    spawnedProcesses.signalAll(SIGINT);
    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      killAfterTimeoutThread = llvm::make_unique<std::thread>(
          &SerialExecutionQueue::killAfterTimeout, this);
    }
  }